

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
::format(elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
         *this,log_msg *msg,tm *param_2,memory_buf_t *dest)

{
  uint uVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> *pdVar2;
  unsigned_long n;
  null_scoped_padder local_59;
  ulong uStack_58;
  null_scoped_padder p;
  size_t n_digits;
  size_t delta_count;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> delta_units;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> delta;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  *this_local;
  
  delta.__r = (rep)dest;
  local_38.__r = (rep)std::chrono::operator-(&msg->time,&this->last_message_time_);
  delta_units.__r = (rep)CLI::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::zero();
  pdVar2 = std::max<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                     (&local_38,(duration<long,_std::ratio<1L,_1000000000L>_> *)&delta_units);
  local_30.__r = pdVar2->__r;
  delta_count = (size_t)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_30);
  (this->last_message_time_).__d.__r = (msg->time).__d.__r;
  n = CLI::std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                ((duration<long,_std::ratio<1L,_1000000L>_> *)&delta_count);
  uVar1 = null_scoped_padder::count_digits<unsigned_long>(n);
  uStack_58 = (ulong)uVar1;
  null_scoped_padder::null_scoped_padder
            (&local_59,uStack_58,&(this->super_flag_formatter).padinfo_,(memory_buf_t *)delta.__r);
  fmt_helper::append_int<unsigned_long>(n,(memory_buf_t *)delta.__r);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto delta = (std::max)(msg.time - last_message_time_, log_clock::duration::zero());
        auto delta_units = std::chrono::duration_cast<DurationUnits>(delta);
        last_message_time_ = msg.time;
        auto delta_count = static_cast<size_t>(delta_units.count());
        auto n_digits = static_cast<size_t>(ScopedPadder::count_digits(delta_count));
        ScopedPadder p(n_digits, padinfo_, dest);
        fmt_helper::append_int(delta_count, dest);
    }